

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractOperator,bool,false,true>
               (timestamp_t *ldata,interval_t *rdata,timestamp_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  Interval *pIVar2;
  int64_t iVar3;
  timestamp_t tVar4;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar5;
  ulong uVar6;
  Interval *pIVar7;
  Interval *extraout_RDX_01;
  ulong uVar8;
  unsigned_long uVar9;
  ulong uVar10;
  idx_t iVar11;
  ulong uVar12;
  interval_t iVar13;
  interval_t interval;
  interval_t interval_00;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      pIVar2 = *(Interval **)rdata;
      iVar3 = rdata->micros;
      iVar11 = 0;
      pIVar7 = pIVar2;
      do {
        tVar4.value = ldata[iVar11].value;
        iVar13.micros = (int64_t)pIVar7;
        iVar13._0_8_ = iVar3;
        iVar13 = Interval::Invert(pIVar2,iVar13);
        tVar4 = Interval::Add(tVar4,iVar13);
        result_data[iVar11].value = tVar4.value;
        iVar11 = iVar11 + 1;
        pIVar7 = extraout_RDX_01;
      } while (count != iVar11);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar6 = 0;
    uVar10 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar9 = 0xffffffffffffffff;
      }
      else {
        uVar9 = puVar1[uVar6];
      }
      uVar8 = uVar10 + 0x40;
      if (count <= uVar10 + 0x40) {
        uVar8 = count;
      }
      uVar5 = uVar8;
      if (uVar9 != 0) {
        uVar5 = uVar10;
        if (uVar9 == 0xffffffffffffffff) {
          if (uVar10 < uVar8) {
            pIVar2 = *(Interval **)rdata;
            iVar3 = rdata->micros;
            uVar12 = uVar6;
            do {
              tVar4.value = ldata[uVar10].value;
              interval.micros = uVar12;
              interval._0_8_ = iVar3;
              iVar13 = Interval::Invert(pIVar2,interval);
              tVar4 = Interval::Add(tVar4,iVar13);
              result_data[uVar10].value = tVar4.value;
              uVar10 = uVar10 + 1;
              uVar12 = extraout_RDX;
              uVar5 = uVar10;
            } while (uVar8 != uVar10);
          }
        }
        else if (uVar10 < uVar8) {
          uVar12 = 0;
          uVar5 = uVar6;
          do {
            if ((uVar9 >> (uVar12 & 0x3f) & 1) != 0) {
              tVar4.value = ldata[uVar10 + uVar12].value;
              interval_00.micros = uVar5;
              interval_00._0_8_ = rdata->micros;
              iVar13 = Interval::Invert(*(Interval **)rdata,interval_00);
              tVar4 = Interval::Add(tVar4,iVar13);
              result_data[uVar10 + uVar12].value = tVar4.value;
              uVar5 = extraout_RDX_00;
            }
            uVar12 = uVar12 + 1;
          } while ((uVar10 - uVar8) + uVar12 != 0);
          uVar5 = uVar10 + uVar12;
        }
      }
      uVar6 = uVar6 + 1;
      uVar10 = uVar5;
    } while (uVar6 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}